

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_application.h
# Opt level: O0

void __thiscall MessageCracker::process(MessageCracker *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  FieldMap *this_00;
  _Self local_3a8;
  _Self local_3a0;
  undefined1 local_398 [8];
  pair<FIX::ClOrdID,_FIX::SessionID> pair;
  ClOrdID *clOrdID;
  BOOLEAN local_1d1;
  undefined1 local_1d0 [8];
  PossResend possResend;
  Message echo;
  SessionID *sessionID_local;
  Message *message_local;
  MessageCracker *this_local;
  
  FIX::Message::Message((Message *)&possResend.super_BoolField.super_FieldBase.m_metrics,message);
  local_1d1 = false;
  FIX::PossResend::PossResend((PossResend *)local_1d0,&local_1d1);
  this_00 = &FIX::Message::getHeader(message)->super_FieldMap;
  FIX::FieldMap::getFieldIfSet(this_00,(FieldBase *)local_1d0);
  pair.second.m_frozenString.field_2._8_8_ =
       FIX::FieldMap::getField<FIX::ClOrdID>((FieldMap *)message);
  std::make_pair<FIX::ClOrdID_const&,FIX::SessionID_const&>
            ((pair<FIX::ClOrdID,_FIX::SessionID> *)local_398,
             (ClOrdID *)pair.second.m_frozenString.field_2._8_8_,sessionID);
  bVar1 = FIX::BoolField::operator_cast_to_bool((BoolField *)local_1d0);
  if (bVar1) {
    local_3a0._M_node =
         (_Base_ptr)
         std::
         set<std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::less<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::allocator<std::pair<FIX::ClOrdID,_FIX::SessionID>_>_>
         ::find(&this->m_orderIDs,(key_type *)local_398);
    local_3a8._M_node =
         (_Base_ptr)
         std::
         set<std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::less<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::allocator<std::pair<FIX::ClOrdID,_FIX::SessionID>_>_>
         ::end(&this->m_orderIDs);
    bVar1 = std::operator!=(&local_3a0,&local_3a8);
    if (bVar1) goto LAB_00144d12;
  }
  std::
  set<std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::less<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::allocator<std::pair<FIX::ClOrdID,_FIX::SessionID>_>_>
  ::insert(&this->m_orderIDs,(value_type *)local_398);
  FIX::Session::sendToTarget
            ((Message *)&possResend.super_BoolField.super_FieldBase.m_metrics,sessionID);
LAB_00144d12:
  std::pair<FIX::ClOrdID,_FIX::SessionID>::~pair((pair<FIX::ClOrdID,_FIX::SessionID> *)local_398);
  FIX::PossResend::~PossResend((PossResend *)local_1d0);
  FIX::Message::~Message((Message *)&possResend.super_BoolField.super_FieldBase.m_metrics);
  return;
}

Assistant:

void process(const FIX::Message &message, const FIX::SessionID &sessionID) {
    FIX::Message echo = message;
    FIX::PossResend possResend(false);
    message.getHeader().getFieldIfSet(possResend);

    auto const &clOrdID = message.getField<FIX::ClOrdID>();

    std::pair<FIX::ClOrdID, FIX::SessionID> pair = std::make_pair(clOrdID, sessionID);

    if (possResend == true) {
      if (m_orderIDs.find(pair) != m_orderIDs.end()) {
        return;
      }
    }
    m_orderIDs.insert(pair);
    FIX::Session::sendToTarget(echo, sessionID);
  }